

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>
::
Set_column<std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
          (Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>
           *this,Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                 *column,Index columnIndex,
          map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  ID_index IVar1;
  reference value;
  Field_operators *pFVar2;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
  *this_00;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Alloc_node local_48;
  reference local_40;
  const_iterator local_38;
  
  *(Index *)this = columnIndex;
  *(map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
    **)(this + 8) = rowContainer;
  local_38._M_node = (_Base_ptr)(this + 0x18);
  *(undefined4 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(_Base_ptr *)(this + 0x28) = local_38._M_node;
  *(_Base_ptr *)(this + 0x30) = local_38._M_node;
  *(undefined8 *)(this + 0x38) = 0;
  pFVar2 = (Field_operators *)0x0;
  if (colSettings == (Column_settings *)0x0) {
    pFVar2 = column->operators_;
  }
  *(Field_operators **)(this + 0x40) = pFVar2;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = (Column_settings *)column->entryPool_;
  }
  *(Column_settings **)(this + 0x48) = colSettings;
  p_Var3 = (column->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(column->column_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      IVar1 = *(ID_index *)(*(long *)(p_Var3 + 1) + 0x18);
      local_40 = (reference)operator_new(0x20);
      (local_40->super_Entry_column_index_option).columnIndex_ = *(uint *)this;
      (local_40->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0
      ;
      (local_40->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0
      ;
      local_40->rowIndex_ = IVar1;
      local_48._M_t =
           (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*>_>
            *)(this + 0x10);
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>>
      ::
      _M_insert_unique_<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*const&,std::_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>>::_Alloc_node>
                ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>*>>
                  *)(this + 0x10),local_38,&local_40,&local_48);
      value = local_40;
      local_48._M_t._0_4_ = IVar1;
      if (*(map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
            **)(this + 8) !=
          (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
           *)0x0) {
        this_00 = &std::
                   map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                   ::operator[](*(map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                                  **)(this + 8),(key_type *)&local_48)->super_type;
        boost::intrusive::
        list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
        ::push_back(this_00,value);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

inline Set_column<Master_matrix>::Set_column(const Set_column& column,
                                             Index columnIndex,
                                             Row_container* rowContainer,
                                             Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(static_cast<const Dim_opt&>(column)),
      Chain_opt(static_cast<const Chain_opt&>(column)),
      operators_(colSettings == nullptr ? column.operators_ : nullptr),
      entryPool_(colSettings == nullptr ? column.entryPool_ : &(colSettings->entryConstructor))
{
  if constexpr (!Master_matrix::Option_list::is_z2) {
    if (colSettings != nullptr) operators_ = &(colSettings->operators);
  }

  for (const Entry* entry : column.column_) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      _insert_entry(entry->get_row_index(), column_.end());
    } else {
      _insert_entry(entry->get_element(), entry->get_row_index(), column_.end());
    }
  }
}